

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_power_budget(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  envy_bios_power_budget_entry *peVar2;
  uint32_t uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar3 = strap;
  uVar1 = (bios->power).budget.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar6 = (ulong)(bios->power).budget.version;
  if ((bios->power).budget.valid != '\0') {
    fprintf((FILE *)out,"POWER BUDGET table at 0x%x, version %x\n",(ulong)uVar1,uVar6);
    if (((bios->power).budget.version | 0x10) == 0x30) {
      fprintf((FILE *)out,"nvidia-smi cap entry: %i\n",(ulong)(bios->power).budget.cap_entry);
    }
    envy_bios_dump_hex(bios,out,(bios->power).budget.offset,(uint)(bios->power).budget.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).budget.entriesnum != '\0') {
      uVar6 = 0xff;
      if (uVar3 != 0) {
        uVar6 = (ulong)(uVar3 >> 2 & 7);
      }
      lVar7 = 0;
      uVar5 = 0;
      do {
        pcVar4 = " ";
        if (uVar6 == uVar5) {
          pcVar4 = "*";
        }
        peVar2 = (bios->power).budget.entries;
        fprintf((FILE *)out,"%s %i: min = %u mW, avg = %u mW, peak = %u mW (unkn12 = %u)\n",pcVar4,
                uVar5 & 0xffffffff,(ulong)*(uint *)((long)&peVar2->min + lVar7),
                (ulong)*(uint *)((long)&peVar2->avg + lVar7),
                (ulong)*(uint *)((long)&peVar2->peak + lVar7),
                (ulong)*(uint *)((long)&peVar2->unkn12 + lVar7));
        envy_bios_dump_hex(bios,out,*(uint *)((long)&((bios->power).budget.entries)->offset + lVar7)
                           ,(uint)(bios->power).budget.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar5 = uVar5 + 1;
        lVar7 = lVar7 + 0x18;
      } while (uVar5 < (bios->power).budget.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse BUDGET table at 0x%x, version %x\n",(ulong)uVar1,uVar6);
  return;
}

Assistant:

void envy_bios_print_power_budget(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_budget *budget = &bios->power.budget;
	int i;

	extern uint32_t strap;
	uint8_t ram_cfg = strap?(strap & 0x1c) >> 2:0xff;


	if (!budget->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!budget->valid) {
		fprintf(out, "Failed to parse BUDGET table at 0x%x, version %x\n", budget->offset, budget->version);
		return;
	}

	fprintf(out, "POWER BUDGET table at 0x%x, version %x\n", budget->offset, budget->version);
	switch(budget->version) {
	case 0x20:
	case 0x30:
		fprintf(out, "nvidia-smi cap entry: %i\n", budget->cap_entry);
		break;
	}
	envy_bios_dump_hex(bios, out, budget->offset, budget->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < budget->entriesnum; i++) {
		fprintf(out, "%s %i: min = %u mW, avg = %u mW, peak = %u mW (unkn12 = %u)\n",
			ram_cfg == i?"*":" ", i, budget->entries[i].min,
			budget->entries[i].avg, budget->entries[i].peak,
			budget->entries[i].unkn12
       		);

		envy_bios_dump_hex(bios, out, budget->entries[i].offset, budget->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}